

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O1

void __thiscall Circuit::sort(Circuit *this,bool test)

{
  pointer puVar1;
  pointer pvVar2;
  byte bVar3;
  bool bVar4;
  ostream *poVar5;
  uint uVar6;
  difference_type __n;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  vector<bool,_std::allocator<bool>_> used;
  allocator_type local_5a;
  bool local_59;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_59 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(ulong)this->nWires,&local_59,&local_5a);
  uVar6 = this->nWires;
  if ((ulong)uVar6 != 0) {
    uVar7 = 0;
    do {
      bVar3 = (byte)uVar7 & 0x3f;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar7 >> 6] =
           local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar7 >> 6] &
           (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  puVar1 = (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar8 != 0) {
    uVar7 = 0;
    uVar6 = 0;
    do {
      for (uVar10 = puVar1[uVar7]; uVar10 != 0; uVar10 = uVar10 - 1) {
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] =
             local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] | 1L << ((byte)uVar6 & 0x3f);
        uVar6 = uVar6 + 1;
      }
      uVar7 = uVar7 + 1;
    } while ((uVar7 & 0xffffffff) < (ulong)(lVar8 >> 2));
  }
  if ((this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      uVar6 = (uint)uVar7;
      if ((test) && (bVar4 = gate_is_ok(this,uVar6,&local_58), !bVar4)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Problem in topological sort",0x1b);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_00105a14:
        abort();
      }
      iVar12 = 0;
      uVar11 = uVar7;
      while( true ) {
        uVar10 = (uint)uVar11;
        bVar4 = gate_is_ok(this,uVar10,&local_58);
        if (bVar4) break;
        uVar11 = (ulong)(uVar10 + 1);
        iVar12 = iVar12 + -1;
        if ((long)(this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2 == uVar11) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Problem in conversion with (current) gate ",0x2a);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::endl<char,std::char_traits<char>>(poVar5);
          output_gate(this,(ostream *)&std::cout,uVar6);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          goto LAB_00105a14;
        }
      }
      if (iVar12 != 0) {
        swap_gate(this,uVar6,uVar10);
      }
      pvVar2 = (this->GateO).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = *(long *)&pvVar2[uVar7].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      lVar9 = (long)*(pointer *)
                     ((long)&pvVar2[uVar7].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data + 8) - lVar8;
      if (lVar9 != 0) {
        uVar7 = 0;
        do {
          uVar10 = *(uint *)(lVar8 + uVar7 * 4);
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] =
               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] | 1L << ((byte)uVar10 & 0x3f);
          uVar7 = uVar7 + 1;
        } while ((uVar7 & 0xffffffff) < (ulong)(lVar9 >> 2));
      }
      uVar7 = (ulong)(uVar6 + 1);
    } while (uVar7 < (ulong)((long)(this->GateT).
                                   super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(this->GateT).
                                   super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  recompute_map(this);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Circuit::sort(bool test) {
  vector<bool> used(nWires);
  for (unsigned int i = 0; i < nWires; i++) {
    used[i] = false;
  }

  // Define inputs
  unsigned int cnt = 0;
  for (unsigned int i = 0; i < numI.size(); i++) {
    for (unsigned int j = 0; j < numI[i]; j++) {
      used[cnt] = true;
      cnt++;
    }
  }

  // Now go through each gate and work out if defined inputs or not
  for (unsigned int i = 0; i < GateT.size(); i++) { // Find next ok gate
    unsigned int j = i;
    if (test && gate_is_ok(i, used) == false) {
      cout << "Problem in topological sort" << endl;
      abort();
    } else {
      while (gate_is_ok(j, used) == false) {
        j++;
        if (j == GateT.size()) {
          cout << "Problem in conversion with (current) gate " << i << endl;
          output_gate(cout, i);
          cout << endl;
          abort();
        }
      }
      // Swap gate i and gate j if i<>j
      if (i != j) {
        swap_gate(i, j);
      }
    }
    // Set output wires to be OK
    for (unsigned int j = 0; j < GateO[i].size(); j++) {
      used[GateO[i][j]] = true;
    }
  }
  recompute_map();
}